

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_templates_ptr
common_chat_templates_init
          (llama_model *model,string *chat_template_override,string *bos_token_override,
          string *eos_token_override)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  pointer pcVar4;
  string *in_RCX;
  string *in_RDX;
  long in_RSI;
  __uniq_ptr_data<common_chat_templates,_common_chat_templates_deleter,_true,_true> in_RDI;
  string *in_R8;
  undefined1 auVar5 [12];
  exception *e_1;
  exception *e;
  anon_class_24_3_9d428893 get_token;
  llama_vocab *vocab;
  string token_eos;
  string token_bos;
  char *str;
  bool has_explicit_template;
  string template_tool_use_src;
  string default_template_src;
  common_chat_templates_ptr *tmpls;
  pointer in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  undefined8 in_stack_fffffffffffffe60;
  llama_token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string *local_e8;
  string *local_e0;
  undefined8 *local_d8;
  undefined8 local_d0;
  string local_c8 [32];
  string local_a8 [32];
  char *local_88;
  undefined4 local_7c;
  undefined8 local_78;
  byte local_69;
  string local_68 [32];
  string local_48 [32];
  string *local_28;
  string *local_20;
  string *local_18;
  long local_10;
  
  token = (llama_token)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  bVar1 = std::__cxx11::string::empty();
  local_69 = (bVar1 ^ 0xff) & 1;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=(local_48,local_18);
  }
  else {
    if (local_10 == 0) {
      auVar5 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/chat.cpp"
                          ,0x17b,"GGML_ASSERT(%s) failed","model != nullptr");
      local_7c = auVar5._8_4_;
      local_78 = auVar5._0_8_;
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_48);
      _Unwind_Resume(local_78);
    }
    local_88 = (char *)llama_model_chat_template(local_10,0);
    if (local_88 != (char *)0x0) {
      std::__cxx11::string::operator=(local_48,local_88);
      local_69 = 1;
    }
    local_88 = (char *)llama_model_chat_template(local_10,"tool_use");
    if (local_88 != (char *)0x0) {
      std::__cxx11::string::operator=(local_68,local_88);
      local_69 = 1;
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) ||
     (bVar2 = std::operator==(in_stack_fffffffffffffe40,
                              &in_stack_fffffffffffffe38->has_explicit_template), bVar2)) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator=(local_48,local_68);
    }
    else {
      std::__cxx11::string::operator=
                (local_48,
                 "{%- for message in messages -%}\n  {{- \'<|im_start|>\' + message.role + \'\n\' + message.content + \'<|im_end|>\n\' -}}\n{%- endfor -%}\n{%- if add_generation_prompt -%}\n  {{- \'<|im_start|>assistant\n\' -}}\n{%- endif -%}"
                );
    }
  }
  std::__cxx11::string::string(local_a8,local_20);
  std::__cxx11::string::string(local_c8,local_28);
  if (local_10 != 0) {
    local_d0 = llama_model_get_vocab(local_10);
    local_e8 = local_48;
    local_e0 = local_68;
    local_d8 = &local_d0;
    llama_vocab_bos(local_d0);
    common_chat_templates_init(llama_model_const*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_0::operator()[abi_cxx11_
              ((anon_class_24_3_9d428893 *)in_stack_fffffffffffffe68,token,
               (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe68 = &local_108;
    std::__cxx11::string::operator=(local_a8,(string *)in_stack_fffffffffffffe68);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffe68);
    llama_vocab_eos(local_d0);
    common_chat_templates_init(llama_model_const*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_0::operator()[abi_cxx11_
              ((anon_class_24_3_9d428893 *)in_stack_fffffffffffffe68,token,
               (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe50);
    std::__cxx11::string::operator=(local_c8,local_128);
    std::__cxx11::string::~string(local_128);
  }
  __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x18)
  ;
  *(undefined8 *)__args_1 = 0;
  __args_1->_M_string_length = 0;
  (__args_1->field_2)._M_allocated_capacity = 0;
  common_chat_templates::common_chat_templates((common_chat_templates *)in_stack_fffffffffffffe40);
  std::unique_ptr<common_chat_templates,common_chat_templates_deleter>::
  unique_ptr<common_chat_templates_deleter,void>
            ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  bVar1 = local_69;
  pcVar4 = std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::operator->
                     ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)0x24d005);
  pcVar4->has_explicit_template = (bool)(bVar1 & 1);
  std::
  make_unique<minja::chat_template,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            (in_stack_fffffffffffffe68,__args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffe58));
  std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::operator->
            ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)0x24d03f);
  std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::operator=
            ((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
             in_stack_fffffffffffffe40,
             (unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
             in_stack_fffffffffffffe38);
  std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::~unique_ptr
            ((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
             in_stack_fffffffffffffe40);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::
    make_unique<minja::chat_template,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              (in_stack_fffffffffffffe68,__args_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffe58));
    std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::operator->
              ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)0x24d1b3);
    std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::operator=
              ((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
               in_stack_fffffffffffffe40,
               (unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
               in_stack_fffffffffffffe38);
    std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::~unique_ptr
              ((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
               in_stack_fffffffffffffe40);
  }
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return (__uniq_ptr_data<common_chat_templates,_common_chat_templates_deleter,_true,_true>)
         (tuple<common_chat_templates_*,_common_chat_templates_deleter>)
         in_RDI.super___uniq_ptr_impl<common_chat_templates,_common_chat_templates_deleter>._M_t.
         super__Tuple_impl<0UL,_common_chat_templates_*,_common_chat_templates_deleter>.
         super__Head_base<0UL,_common_chat_templates_*,_false>._M_head_impl;
}

Assistant:

common_chat_templates_ptr common_chat_templates_init(
    const struct llama_model * model,
    const std::string & chat_template_override,
    const std::string & bos_token_override,
    const std::string & eos_token_override)
{
    std::string default_template_src;
    std::string template_tool_use_src;

    bool has_explicit_template = !chat_template_override.empty();
    if (chat_template_override.empty()) {
        GGML_ASSERT(model != nullptr);
        const auto * str = llama_model_chat_template(model, /* name */ nullptr);
        if (str) {
            default_template_src = str;
            has_explicit_template = true;
        }
        str = llama_model_chat_template(model, /* name */ "tool_use");
        if (str) {
            template_tool_use_src = str;
            has_explicit_template = true;
        }
    } else {
        default_template_src = chat_template_override;
    }
    if (default_template_src.empty() || default_template_src == "chatml") {
        if (!template_tool_use_src.empty()) {
            default_template_src = template_tool_use_src;
        } else {
            default_template_src = CHATML_TEMPLATE_SRC;
        }
    }
    std::string token_bos = bos_token_override;
    std::string token_eos = eos_token_override;
    if (model) {
        const auto * vocab = llama_model_get_vocab(model);
        const auto get_token = [&](llama_token token, const char * name, const char * jinja_variable_name) {
            if (token == LLAMA_TOKEN_NULL) {
                if (default_template_src.find(jinja_variable_name) != std::string::npos
                    || template_tool_use_src.find(jinja_variable_name) != std::string::npos) {
                    LOG_WRN("common_chat_templates_init: warning: vocab does not have a %s token, jinja template won't work as intended.\n", name);
                }
                return std::string();
            }
            return common_token_to_piece(vocab, token, true);
        };
        token_bos = get_token(llama_vocab_bos(vocab), "BOS", "bos_token");
        token_eos = get_token(llama_vocab_eos(vocab), "EOS", "eos_token");
    }
    common_chat_templates_ptr tmpls(new common_chat_templates());
    tmpls->has_explicit_template = has_explicit_template;
    try {
        tmpls->template_default = std::make_unique<minja::chat_template>(default_template_src, token_bos, token_eos);
    } catch (const std::exception & e) {
        LOG_ERR("%s: failed to parse chat template (defaulting to chatml): %s \n", __func__, e.what());
        tmpls->template_default = std::make_unique<minja::chat_template>(CHATML_TEMPLATE_SRC, token_bos, token_eos);
    }
    if (!template_tool_use_src.empty()) {
        try {
            tmpls->template_tool_use = std::make_unique<minja::chat_template>(template_tool_use_src, token_bos, token_eos);
        } catch (const std::exception & e) {
            LOG_ERR("%s: failed to parse tool use chat template (ignoring it): %s\n", __func__, e.what());
        }
    }
    return tmpls;
}